

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O0

unsigned_long
duckdb::Chimp128Decompression<unsigned_long>::DecompressValue
          (Flags flag,uint8_t *leading_zeros,uint32_t *leading_zero_index,
          UnpackedData *unpacked_data,uint32_t *unpacked_index,DecompressState *state)

{
  uint uVar1;
  undefined1 *puVar2;
  uint64_t *puVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  long in_RCX;
  uint *in_RDX;
  long in_RSI;
  undefined1 in_DIL;
  uint *in_R8;
  long in_R9;
  UnpackedData *unpacked;
  uchar index;
  unsigned_long result;
  uint8_t *in_stack_ffffffffffffff58;
  BitReader *in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [7];
  Flags in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  InternalException *in_stack_ffffffffffffffa0;
  uchar local_39;
  ulong local_38;
  long local_30;
  
  local_30 = in_R9;
  switch(in_DIL) {
  case 0:
    local_39 = BitReader::ReadValue<unsigned_char,(unsigned_char)7>(in_stack_ffffffffffffff60);
    puVar3 = RingBuffer<unsigned_long>::Value
                       ((RingBuffer<unsigned_long> *)(local_30 + 0x20),&local_39);
    local_38 = UnsafeNumericCast<unsigned_long,unsigned_long,void>(*puVar3);
    break;
  case 1:
    uVar1 = *in_R8;
    *in_R8 = uVar1 + 1;
    puVar2 = (undefined1 *)(in_RCX + (ulong)uVar1 * 3);
    *(undefined1 *)(in_R9 + 0x10) = *puVar2;
    *(char *)(in_R9 + 0x11) = ('@' - puVar2[1]) - *(char *)(in_R9 + 0x10);
    uVar4 = BitReader::ReadValue<unsigned_long>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
    ;
    local_38 = uVar4 << (*(byte *)(local_30 + 0x11) & 0x3f);
    puVar3 = RingBuffer<unsigned_long>::Value
                       ((RingBuffer<unsigned_long> *)(local_30 + 0x20),puVar2 + 2);
    local_38 = *puVar3 ^ local_38;
    break;
  case 2:
    uVar4 = BitReader::ReadValue<unsigned_long>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
    ;
    local_38 = *(ulong *)(local_30 + 0x18) ^ uVar4;
    break;
  case 3:
    uVar1 = *in_RDX;
    *in_RDX = uVar1 + 1;
    *(undefined1 *)(in_R9 + 0x10) = *(undefined1 *)(in_RSI + (ulong)uVar1);
    uVar4 = BitReader::ReadValue<unsigned_long>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
    ;
    local_38 = *(ulong *)(local_30 + 0x18) ^ uVar4;
    break;
  default:
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_70,"Chimp compression flag with value %d not recognized",&local_71);
    InternalException::InternalException<duckdb::ChimpConstants::Flags>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
    __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
  }
  *(ulong *)(local_30 + 0x18) = local_38;
  RingBuffer<unsigned_long>::InsertScan<false>
            ((RingBuffer<unsigned_long> *)(local_30 + 0x20),local_38);
  return local_38;
}

Assistant:

static inline CHIMP_TYPE DecompressValue(ChimpConstants::Flags flag, uint8_t leading_zeros[],
	                                         uint32_t &leading_zero_index, UnpackedData unpacked_data[],
	                                         uint32_t &unpacked_index, DecompressState &state) {
		CHIMP_TYPE result;
		switch (flag) {
		case ChimpConstants::Flags::VALUE_IDENTICAL: {
			//! Value is identical to previous value
			auto index = state.input.template ReadValue<uint8_t, 7>();
			result = UnsafeNumericCast<CHIMP_TYPE>(state.ring_buffer.Value(index));
			break;
		}
		case ChimpConstants::Flags::TRAILING_EXCEEDS_THRESHOLD: {
			const UnpackedData &unpacked = unpacked_data[unpacked_index++];
			state.leading_zeros = unpacked.leading_zero;
			state.trailing_zeros = BIT_SIZE - unpacked.significant_bits - state.leading_zeros;
			result = state.input.template ReadValue<CHIMP_TYPE>(unpacked.significant_bits);
			result <<= state.trailing_zeros;
			result ^= state.ring_buffer.Value(unpacked.index);
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_EQUALITY: {
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_LOAD: {
			state.leading_zeros = leading_zeros[leading_zero_index++];
			D_ASSERT(state.leading_zeros <= BIT_SIZE);
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		default:
			throw InternalException("Chimp compression flag with value %d not recognized", flag);
		}
		state.reference_value = result;
		state.ring_buffer.InsertScan(result);
		return result;
	}